

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudio_CreateSubmixVoice
                   (FAudio *audio,FAudioSubmixVoice **ppSubmixVoice,uint32_t InputChannels,
                   uint32_t InputSampleRate,uint32_t Flags,uint32_t ProcessingStage,
                   FAudioVoiceSends *pSendList,FAudioEffectChain *pEffectChain)

{
  uint uVar1;
  FAudioVoice *voice;
  FAudioSubmixVoice *pFVar2;
  FAudioMutex pvVar3;
  FAudioResampleCallback *pp_Var4;
  code *pcVar5;
  float *pfVar6;
  FAudioFilterState *pafVar7;
  ulong uVar8;
  double dVar9;
  
  pFVar2 = (FAudioSubmixVoice *)(*audio->pMalloc)(0x148);
  *ppSubmixVoice = pFVar2;
  SDL_memset(pFVar2,0,0x148);
  (*ppSubmixVoice)->audio = audio;
  pFVar2 = *ppSubmixVoice;
  pFVar2->type = FAUDIO_VOICE_SUBMIX;
  pFVar2->flags = Flags;
  (pFVar2->filter).Type = FAudioLowPassFilter;
  (pFVar2->filter).Frequency = 1.0;
  (pFVar2->filter).OneOverQ = 1.0;
  pvVar3 = FAudio_PlatformCreateMutex();
  (*ppSubmixVoice)->sendLock = pvVar3;
  pvVar3 = FAudio_PlatformCreateMutex();
  (*ppSubmixVoice)->effectLock = pvVar3;
  pvVar3 = FAudio_PlatformCreateMutex();
  (*ppSubmixVoice)->filterLock = pvVar3;
  pvVar3 = FAudio_PlatformCreateMutex();
  (*ppSubmixVoice)->volumeLock = pvVar3;
  ((*ppSubmixVoice)->field_19).mix.inputChannels = InputChannels;
  ((*ppSubmixVoice)->field_19).mix.inputSampleRate = InputSampleRate;
  ((*ppSubmixVoice)->field_19).src.curBufferOffset = ProcessingStage;
  if (InputChannels == 2) {
    pp_Var4 = &FAudio_INTERNAL_ResampleStereo;
  }
  else {
    if (InputChannels != 1) {
      pcVar5 = FAudio_INTERNAL_ResampleGeneric;
      goto LAB_00113473;
    }
    pp_Var4 = &FAudio_INTERNAL_ResampleMono;
  }
  pcVar5 = *pp_Var4;
LAB_00113473:
  ((*ppSubmixVoice)->field_19).mix.resample = pcVar5;
  dVar9 = (double)SDL_ceil(((double)InputSampleRate * (double)audio->updateSize) /
                           (double)(audio->master->field_19).master.inputSampleRate);
  ((*ppSubmixVoice)->field_19).src.decodeSamples = ((int)(long)dVar9 + 2) * InputChannels;
  pfVar6 = (float *)(*audio->pMalloc)((ulong)((*ppSubmixVoice)->field_19).src.decodeSamples << 2);
  ((*ppSubmixVoice)->field_19).mix.inputCache = pfVar6;
  SDL_memset(((*ppSubmixVoice)->field_19).mix.inputCache,0,
             (ulong)((*ppSubmixVoice)->field_19).src.decodeSamples << 2);
  FAudio_INTERNAL_VoiceOutputFrequency(*ppSubmixVoice,pSendList);
  FAudioVoice_SetEffectChain(*ppSubmixVoice,pEffectChain);
  pFVar2 = *ppSubmixVoice;
  pFVar2->volume = 1.0;
  pfVar6 = (float *)(*audio->pMalloc)((ulong)pFVar2->outputChannels << 2);
  (*ppSubmixVoice)->channelVolume = pfVar6;
  voice = *ppSubmixVoice;
  uVar1 = voice->outputChannels;
  for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
    voice->channelVolume[uVar8] = 1.0;
  }
  FAudioVoice_SetOutputVoices(voice,pSendList);
  if ((Flags & 8) != 0) {
    pafVar7 = (FAudioFilterState *)(*audio->pMalloc)((ulong)InputChannels << 4);
    (*ppSubmixVoice)->filterState = pafVar7;
    SDL_memset((*ppSubmixVoice)->filterState,0,(ulong)InputChannels << 4);
  }
  FAudio_INTERNAL_InsertSubmixSorted
            (&audio->submixes,*ppSubmixVoice,audio->submixLock,audio->pMalloc);
  audio->refcount = audio->refcount + 1;
  return 0;
}

Assistant:

uint32_t FAudio_CreateSubmixVoice(
	FAudio *audio,
	FAudioSubmixVoice **ppSubmixVoice,
	uint32_t InputChannels,
	uint32_t InputSampleRate,
	uint32_t Flags,
	uint32_t ProcessingStage,
	const FAudioVoiceSends *pSendList,
	const FAudioEffectChain *pEffectChain
) {
	uint32_t i;

	LOG_API_ENTER(audio)

	*ppSubmixVoice = (FAudioSubmixVoice*) audio->pMalloc(sizeof(FAudioVoice));
	FAudio_zero(*ppSubmixVoice, sizeof(FAudioSubmixVoice));
	(*ppSubmixVoice)->audio = audio;
	(*ppSubmixVoice)->type = FAUDIO_VOICE_SUBMIX;
	(*ppSubmixVoice)->flags = Flags;
	(*ppSubmixVoice)->filter.Type = FAUDIO_DEFAULT_FILTER_TYPE;
	(*ppSubmixVoice)->filter.Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
	(*ppSubmixVoice)->filter.OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
	(*ppSubmixVoice)->sendLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->sendLock)
	(*ppSubmixVoice)->effectLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->effectLock)
	(*ppSubmixVoice)->filterLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->filterLock)
	(*ppSubmixVoice)->volumeLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSubmixVoice)->volumeLock)

	/* Submix Properties */
	(*ppSubmixVoice)->mix.inputChannels = InputChannels;
	(*ppSubmixVoice)->mix.inputSampleRate = InputSampleRate;
	(*ppSubmixVoice)->mix.processingStage = ProcessingStage;

	/* Resampler */
	if (InputChannels == 1)
	{
		(*ppSubmixVoice)->mix.resample = FAudio_INTERNAL_ResampleMono;
	}
	else if (InputChannels == 2)
	{
		(*ppSubmixVoice)->mix.resample = FAudio_INTERNAL_ResampleStereo;
	}
	else
	{
		(*ppSubmixVoice)->mix.resample = FAudio_INTERNAL_ResampleGeneric;
	}

	/* Sample Storage */
	(*ppSubmixVoice)->mix.inputSamples = ((uint32_t) FAudio_ceil(
		audio->updateSize *
		(double) InputSampleRate /
		(double) audio->master->master.inputSampleRate
	) + EXTRA_DECODE_PADDING) * InputChannels;
	(*ppSubmixVoice)->mix.inputCache = (float*) audio->pMalloc(
		sizeof(float) * (*ppSubmixVoice)->mix.inputSamples
	);
	FAudio_zero( /* Zero this now, for the first update */
		(*ppSubmixVoice)->mix.inputCache,
		sizeof(float) * (*ppSubmixVoice)->mix.inputSamples
	);

	/* Sends/Effects */
	FAudio_INTERNAL_VoiceOutputFrequency(*ppSubmixVoice, pSendList);
	FAudioVoice_SetEffectChain(*ppSubmixVoice, pEffectChain);

	/* Default Levels */
	(*ppSubmixVoice)->volume = 1.0f;
	(*ppSubmixVoice)->channelVolume = (float*) audio->pMalloc(
		sizeof(float) * (*ppSubmixVoice)->outputChannels
	);
	for (i = 0; i < (*ppSubmixVoice)->outputChannels; i += 1)
	{
		(*ppSubmixVoice)->channelVolume[i] = 1.0f;
	}

	FAudioVoice_SetOutputVoices(*ppSubmixVoice, pSendList);

	/* Filters */
	if (Flags & FAUDIO_VOICE_USEFILTER)
	{
		(*ppSubmixVoice)->filterState = (FAudioFilterState*) audio->pMalloc(
			sizeof(FAudioFilterState) * InputChannels
		);
		FAudio_zero(
			(*ppSubmixVoice)->filterState,
			sizeof(FAudioFilterState) * InputChannels
		);
	}

	/* Add to list, finally. */
	FAudio_INTERNAL_InsertSubmixSorted(
		&audio->submixes,
		*ppSubmixVoice,
		audio->submixLock,
		audio->pMalloc
	);
	FAudio_AddRef(audio);

	LOG_API_EXIT(audio)
	return 0;
}